

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O1

bool Function_Template::form2_ExtractChannel(ExtractChannelForm2 ExtractChannel)

{
  uint8_t value;
  bool bVar1;
  uint uVar2;
  Image output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  Image input;
  ImageTemplate<unsigned_char> local_b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  Image local_78;
  ImageTemplate<unsigned_char> local_50;
  
  Unit_Test::intensityArray(&local_90,3);
  value = *local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_b8,0,0,'\x01','\x01');
  Test_Helper::uniformRGBImage(&local_78,value,&local_b8);
  local_b8._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_b8);
  Unit_Test::fillImage(&local_78,0,0,local_78._width,local_78._height,&local_90);
  uVar2 = rand();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_50,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&local_b8,local_78._width,local_78._height,&local_50);
  local_50._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_50);
  (*ExtractChannel)(&local_78,&local_b8,(uint8_t)(uVar2 % 3));
  bVar1 = Unit_Test::verifyImage
                    (&local_b8,
                     local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar2 % 3]);
  local_b8._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_b8);
  local_78._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_78);
  if (local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1 && local_b8._colorCount == '\x01';
}

Assistant:

bool form2_ExtractChannel(ExtractChannelForm2 ExtractChannel)
    {
        const std::vector < uint8_t > intensity = intensityArray( 3 );
        PenguinV_Image::Image input = uniformRGBImage( intensity[0] );
        fillImage( input, 0, 0, input.width(), input.height(), intensity );

        const uint8_t channelId = randomValue<uint8_t>( 3 );
        PenguinV_Image::Image output = uniformImage( input.width(), input.height() );

        ExtractChannel( input, output, channelId );

        return verifyImage( output, intensity[channelId] ) && (output.colorCount() == PenguinV_Image::GRAY_SCALE);
    }